

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

v6 * __thiscall
fmt::v6::to_string<char,500ul>
          (v6 *this,basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  allocator local_4d [13];
  string local_40 [32];
  size_t local_20;
  size_t size;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_local;
  
  size = (size_t)buf;
  buf_local = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)this;
  sVar1 = detail::buffer<char>::size(&buf->super_buffer<char>);
  local_20 = sVar1;
  std::__cxx11::string::string(local_40);
  uVar2 = std::__cxx11::string::max_size();
  detail::assume(sVar1 < uVar2);
  std::__cxx11::string::~string(local_40);
  pcVar3 = detail::buffer<char>::data((buffer<char> *)size);
  sVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar3,sVar1,local_4d);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  return this;
}

Assistant:

std::basic_string<Char> to_string(const basic_memory_buffer<Char, SIZE>& buf) {
  auto size = buf.size();
  detail::assume(size < std::basic_string<Char>().max_size());
  return std::basic_string<Char>(buf.data(), size);
}